

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

void AddSpecialSearchParams(Args *args,SearchParams<DNA> *sp)

{
  bool bVar1;
  mapped_type *this;
  string *psVar2;
  allocator local_59;
  key_type local_58;
  undefined1 local_38 [8];
  string str;
  SearchParams<DNA> *sp_local;
  Args *args_local;
  
  str.field_2._8_8_ = sp;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"--strand",&local_59);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
         ::at(args,&local_58);
  psVar2 = docopt::value::asString_abi_cxx11_(this);
  std::__cxx11::string::string((string *)local_38,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  *(undefined4 *)(str.field_2._8_8_ + 0xc) = 0;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"minus");
  if (bVar1) {
    *(undefined4 *)(str.field_2._8_8_ + 0xc) = 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"both");
    if (bVar1) {
      *(undefined4 *)(str.field_2._8_8_ + 0xc) = 2;
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void AddSpecialSearchParams( const Args& args, SearchParams< DNA >* sp ) {
  auto str = args.at( "--strand" ).asString();
  sp->strand = DNA::Strand::Plus;
  if( str == "minus" ) {
    sp->strand = DNA::Strand::Minus;
  } else if( str == "both" ) {
    sp->strand = DNA::Strand::Both;
  }
}